

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void __thiscall ConvexDecomposition::Array<int>::allocate(Array<int> *this,int s)

{
  uint uVar1;
  int *__ptr;
  int *piVar2;
  ulong uVar3;
  
  if (s < 1) {
    __assert_fail("s>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5bf,"void ConvexDecomposition::Array<int>::allocate(int) [Type = int]");
  }
  uVar1 = this->count;
  if ((int)uVar1 <= s) {
    __ptr = this->element;
    this->array_size = s;
    piVar2 = (int *)malloc((ulong)(uint)s << 2);
    this->element = piVar2;
    if (piVar2 != (int *)0x0) {
      for (uVar3 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar3; uVar3 = uVar3 + 1) {
        piVar2[uVar3] = __ptr[uVar3];
      }
      free(__ptr);
      return;
    }
    __assert_fail("element",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x5c4,"void ConvexDecomposition::Array<int>::allocate(int) [Type = int]");
  }
  __assert_fail("s>=count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x5c0,"void ConvexDecomposition::Array<int>::allocate(int) [Type = int]");
}

Assistant:

void Array<Type>::allocate(int s)
{
	assert(s>0);
	assert(s>=count);
	Type *old = element;
	array_size =s;
	element = (Type *) malloc( sizeof(Type)*array_size);
	assert(element);
	for(int i=0;i<count;i++)
	{
		element[i]=old[i];
	}
	if(old)
	{
		free(old);
	}
}